

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<unsigned_char,ImPlot::TransformerLinLog>
               (TransformerLinLog transformer,ImDrawList *DrawList,uchar *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  ImPlotPlot *pIVar3;
  double dVar4;
  double dVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  uchar *puVar9;
  ImU32 col;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ImVec4 IVar21;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  undefined1 local_158 [16];
  ImVec2 local_118;
  int local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  double local_f0;
  double local_e8;
  uchar *local_e0;
  char *local_d8;
  double local_d0;
  long local_c8;
  ulong local_c0;
  ImDrawList *local_b8;
  double local_b0;
  uchar *local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [24];
  double local_80;
  ulong local_78;
  ImVec2 local_70;
  double local_68;
  undefined8 uStack_60;
  undefined1 local_58 [12];
  float fStack_4c;
  
  pIVar6 = GImPlot;
  if (0 < rows) {
    dVar17 = (bounds_max->x - bounds_min->x) / (double)cols;
    local_e8 = (bounds_max->y - bounds_min->y) / (double)rows;
    dVar16 = dVar17 * 0.5;
    dVar19 = local_e8 * 0.5;
    lVar12 = (long)transformer.YAxis;
    local_b0 = scale_max - scale_min;
    local_c0 = (ulong)(uint)cols;
    uVar10 = 0;
    local_f0 = local_e8 * 0.5;
    dVar18 = dVar17 * 0.5;
    local_c8 = lVar12 * 0x10;
    dVar20 = 0.0;
    iVar13 = 0;
    uStack_60 = 0;
    local_108 = dVar19;
    local_e0 = values;
    local_d8 = fmt;
    local_d0 = scale_min;
    local_b8 = DrawList;
    local_68 = dVar17;
    do {
      puVar9 = local_e0;
      if (0 < cols) {
        dVar4 = local_e8 * dVar20 + local_f0;
        dVar5 = 0.0;
        lVar14 = 0;
        local_10c = iVar13;
        local_80 = dVar20;
        local_78 = uVar10;
        do {
          pIVar7 = GImPlot;
          local_98._0_8_ = dVar5;
          dVar5 = dVar5 * dVar17 + bounds_min->x + dVar18;
          dVar20 = bounds_max->y - dVar4;
          local_a8 = (uchar *)(dVar5 - dVar16);
          uStack_a0 = 0;
          dVar19 = log10((dVar20 - dVar19) / GImPlot->CurrentPlot->YAxis[lVar12].Range.Min);
          pIVar8 = GImPlot;
          pIVar3 = pIVar7->CurrentPlot;
          dVar17 = pIVar3->YAxis[lVar12].Range.Min;
          IVar1 = pIVar7->PixelRange[lVar12].Min;
          local_118.y = (float)(pIVar7->My[lVar12] *
                                (((double)(float)(dVar19 / pIVar7->LogDenY[lVar12]) *
                                  (pIVar3->YAxis[lVar12].Range.Max - dVar17) + dVar17) - dVar17) +
                               (double)IVar1.y);
          local_118.x = (float)(pIVar7->Mx * ((double)local_a8 - (pIVar3->XAxis).Range.Min) +
                               (double)IVar1.x);
          dVar19 = log10((dVar20 + local_108) / GImPlot->CurrentPlot->YAxis[lVar12].Range.Min);
          pIVar3 = pIVar8->CurrentPlot;
          dVar17 = pIVar3->YAxis[lVar12].Range.Min;
          IVar1 = pIVar8->PixelRange[lVar12].Min;
          local_70.y = (float)(pIVar8->My[lVar12] *
                               (((double)(float)(dVar19 / pIVar8->LogDenY[lVar12]) *
                                 (pIVar3->YAxis[lVar12].Range.Max - dVar17) + dVar17) - dVar17) +
                              (double)IVar1.y);
          local_70.x = (float)(pIVar8->Mx * ((dVar5 + dVar16) - (pIVar3->XAxis).Range.Min) +
                              (double)IVar1.x);
          IVar21 = LerpColormap((float)(((double)puVar9[lVar14 + (int)uVar10] - local_d0) / local_b0
                                       + 0.0));
          local_58 = IVar21._0_12_;
          fStack_4c = IVar21.w * (pIVar6->Style).FillAlpha;
          col = ImGui::GetColorU32((ImVec4 *)local_58);
          ImDrawList::AddRectFilled(local_b8,&local_118,&local_70,col,0.0,0xf);
          dVar5 = (double)local_98._0_8_ + 1.0;
          lVar14 = lVar14 + 1;
          dVar17 = local_68;
          dVar19 = local_108;
        } while ((int)local_c0 != (int)lVar14);
        uVar10 = (ulong)(uint)((int)local_78 + (int)lVar14);
        dVar20 = local_80;
        iVar13 = local_10c;
      }
      dVar20 = dVar20 + 1.0;
      iVar13 = iVar13 + 1;
    } while (iVar13 != rows);
    if (local_d8 != (char *)0x0 && 0 < rows) {
      iVar13 = 0;
      dVar17 = 0.0;
      iVar11 = 0;
      do {
        if (0 < cols) {
          dVar19 = local_e8 * dVar17 + local_f0;
          local_a8 = local_e0 + iVar13;
          local_158 = ZEXT816(0);
          lVar14 = 0;
          do {
            pIVar6 = GImPlot;
            local_108 = bounds_min->x + dVar16;
            uStack_100 = 0;
            dVar18 = log10(((bounds_min->y + 1.0) - dVar19) /
                           GImPlot->CurrentPlot->YAxis[lVar12].Range.Min);
            puVar9 = local_a8;
            pIVar3 = pIVar6->CurrentPlot;
            dVar20 = pIVar3->YAxis[lVar12].Range.Min;
            uVar2 = *(undefined8 *)((long)&pIVar6->PixelRange[0].Min.x + local_c8);
            local_108._0_4_ =
                 (float)(pIVar6->Mx *
                         ((local_108 + local_68 * (double)local_158._0_8_) -
                         (pIVar3->XAxis).Range.Min) + (double)(float)uVar2);
            local_108._4_4_ =
                 (float)(pIVar6->My[lVar12] *
                         ((dVar20 + (double)(float)(dVar18 / pIVar6->LogDenY[lVar12]) *
                                    (pIVar3->YAxis[lVar12].Range.Max - dVar20)) - dVar20) +
                        (double)(float)((ulong)uVar2 >> 0x20));
            uStack_100 = 0;
            sprintf(local_58,local_d8,(ulong)local_a8[lVar14]);
            IVar1 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
            local_98._8_4_ = extraout_XMM0_Dc;
            local_98._0_4_ = IVar1.x;
            local_98._4_4_ = IVar1.y;
            local_98._12_4_ = extraout_XMM0_Dd;
            IVar21 = LerpColormap((float)(((double)puVar9[lVar14] - local_d0) / local_b0 + 0.0));
            local_118.y = (float)local_98._4_4_ * -0.5 + local_108._4_4_;
            local_118.x = (float)local_98._0_4_ * -0.5 + (float)local_108;
            ImDrawList::AddText(local_b8,&local_118,
                                -(uint)(IVar21.z * 0.114 + IVar21.x * 0.299 + IVar21.y * 0.587 <=
                                       0.5) | 0xff000000,local_58,(char *)0x0);
            uVar15 = local_158._12_4_;
            local_158._8_4_ = local_158._8_4_;
            local_158._0_8_ = (double)local_158._0_8_ + 1.0;
            local_158._12_4_ = uVar15;
            lVar14 = lVar14 + 1;
          } while ((int)local_c0 != (int)lVar14);
          iVar13 = iVar13 + (int)lVar14;
        }
        dVar17 = dVar17 + 1.0;
        iVar11 = iVar11 + 1;
      } while (iVar11 != rows);
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}